

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawCmdHeader *pIVar1;
  ImDrawChannel *pIVar2;
  unsigned_short *__src;
  ImDrawChannel *pIVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  ulong uVar11;
  ImDrawCmd *pIVar12;
  long lVar13;
  ImDrawCmd *pIVar14;
  long lVar15;
  uint *puVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  unsigned_short *local_40;
  
  if (this->_Count < 2) {
    return;
  }
  iVar18 = 0;
  SetCurrentChannel(this,draw_list,0);
  ImDrawList::_PopUnusedDrawCmd(draw_list);
  iVar17 = 0;
  if (0 < this->_Count) {
    lVar15 = (long)(draw_list->CmdBuffer).Size;
    iVar18 = 0;
    if (lVar15 < 1) {
LAB_0018960e:
      pIVar12 = (ImDrawCmd *)0x0;
      uVar22 = 0;
    }
    else {
      pIVar14 = (draw_list->CmdBuffer).Data;
      pIVar12 = pIVar14 + lVar15 + -1;
      if (pIVar12 == (ImDrawCmd *)0x0) goto LAB_0018960e;
      uVar22 = pIVar14[lVar15 + -1].ElemCount + pIVar14[lVar15 + -1].IdxOffset;
    }
    if (this->_Count != 1) {
      iVar17 = 0;
      lVar15 = 1;
      iVar18 = 0;
      do {
        if ((this->_Channels).Size <= lVar15) goto LAB_00189975;
        pIVar2 = (this->_Channels).Data;
        pIVar3 = pIVar2 + lVar15;
        iVar20 = pIVar2[lVar15]._CmdBuffer.Size;
        uVar11 = (ulong)iVar20;
        if ((long)uVar11 < 1) {
LAB_001896fe:
          iVar19 = (pIVar3->_IdxBuffer).Size;
        }
        else {
          if ((pIVar3->_CmdBuffer).Data[uVar11 - 1].ElemCount == 0) {
            uVar11 = (ulong)(iVar20 - 1U);
            (pIVar3->_CmdBuffer).Size = iVar20 - 1U;
          }
          if (((int)uVar11 == 0) || (pIVar12 == (ImDrawCmd *)0x0)) {
LAB_001896ce:
            iVar20 = (int)uVar11;
            if (iVar20 < 1) goto LAB_001896fe;
          }
          else {
            pIVar14 = (pIVar3->_CmdBuffer).Data;
            auVar4 = vpor_avx((undefined1  [16])pIVar12->ClipRect ^
                              (undefined1  [16])pIVar14->ClipRect,
                              *(undefined1 (*) [16])&(pIVar12->ClipRect).w ^
                              *(undefined1 (*) [16])&(pIVar14->ClipRect).w);
            if ((auVar4 == (undefined1  [16])0x0) &&
               (pIVar14->UserCallback == (ImDrawCallback)0x0 &&
                pIVar12->UserCallback == (ImDrawCallback)0x0)) {
              pIVar12->ElemCount = pIVar12->ElemCount + pIVar14->ElemCount;
              uVar22 = uVar22 + pIVar14->ElemCount;
              memmove(pIVar14,pIVar14 + 1,(uVar11 & 0xffffffff) * 0x38 - 0x38);
              uVar10 = (pIVar3->_CmdBuffer).Size - 1;
              uVar11 = (ulong)uVar10;
              (pIVar3->_CmdBuffer).Size = uVar10;
              goto LAB_001896ce;
            }
          }
          pIVar14 = (pIVar3->_CmdBuffer).Data;
          iVar20 = (int)uVar11;
          uVar11 = uVar11 & 0xffffffff;
          pIVar12 = pIVar14 + (uVar11 - 1);
          iVar19 = (pIVar3->_IdxBuffer).Size;
          puVar16 = &pIVar14->ElemCount;
          do {
            puVar16[-1] = uVar22;
            uVar22 = uVar22 + *puVar16;
            puVar16 = puVar16 + 0xe;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        iVar18 = iVar18 + iVar19;
        iVar17 = iVar17 + iVar20;
        lVar15 = lVar15 + 1;
      } while (lVar15 < this->_Count);
    }
  }
  uVar22 = (draw_list->CmdBuffer).Size + iVar17;
  iVar20 = (draw_list->CmdBuffer).Capacity;
  if (iVar20 < (int)uVar22) {
    if (iVar20 == 0) {
      uVar10 = 8;
    }
    else {
      uVar10 = iVar20 / 2 + iVar20;
    }
    if ((int)uVar10 <= (int)uVar22) {
      uVar10 = uVar22;
    }
    pIVar12 = (ImDrawCmd *)ImGui::MemAlloc((long)(int)uVar10 * 0x38);
    pIVar14 = (draw_list->CmdBuffer).Data;
    if (pIVar14 != (ImDrawCmd *)0x0) {
      memcpy(pIVar12,pIVar14,(long)(draw_list->CmdBuffer).Size * 0x38);
      ImGui::MemFree((draw_list->CmdBuffer).Data);
    }
    (draw_list->CmdBuffer).Data = pIVar12;
    (draw_list->CmdBuffer).Capacity = uVar10;
  }
  (draw_list->CmdBuffer).Size = uVar22;
  lVar15 = (long)(draw_list->IdxBuffer).Size + (long)iVar18;
  iVar20 = (draw_list->IdxBuffer).Capacity;
  iVar19 = (int)lVar15;
  if (iVar20 < iVar19) {
    if (iVar20 == 0) {
      iVar20 = 8;
    }
    else {
      iVar20 = iVar20 / 2 + iVar20;
    }
    if (iVar20 <= iVar19) {
      iVar20 = iVar19;
    }
    local_40 = (unsigned_short *)ImGui::MemAlloc((long)iVar20 * 2);
    __src = (draw_list->IdxBuffer).Data;
    if (__src != (unsigned_short *)0x0) {
      memcpy(local_40,__src,(long)(draw_list->IdxBuffer).Size * 2);
      ImGui::MemFree((draw_list->IdxBuffer).Data);
    }
    (draw_list->IdxBuffer).Data = local_40;
    (draw_list->IdxBuffer).Capacity = iVar20;
    uVar22 = (draw_list->CmdBuffer).Size;
  }
  else {
    local_40 = (draw_list->IdxBuffer).Data;
  }
  (draw_list->IdxBuffer).Size = iVar19;
  local_40 = local_40 + (lVar15 - iVar18);
  if (1 < this->_Count) {
    pIVar14 = (draw_list->CmdBuffer).Data + ((long)(int)uVar22 - (long)iVar17);
    lVar21 = 1;
    lVar15 = 0x38;
    do {
      if ((this->_Channels).Size <= lVar21) {
LAB_00189975:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                      ,0x66a,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
      }
      pIVar3 = (this->_Channels).Data;
      lVar13 = (long)*(int *)((long)pIVar3 + lVar15 + -0x18);
      if (lVar13 != 0) {
        memcpy(pIVar14,*(void **)((long)pIVar3 + lVar15 + -0x10),lVar13 * 0x38);
        pIVar14 = pIVar14 + lVar13;
      }
      lVar13 = (long)*(int *)((long)pIVar3 + lVar15 + -8);
      if (lVar13 != 0) {
        memcpy(local_40,*(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar15),lVar13 * 2);
        local_40 = local_40 + lVar13;
      }
      lVar21 = lVar21 + 1;
      lVar15 = lVar15 + 0x20;
    } while (lVar21 < this->_Count);
    uVar22 = (draw_list->CmdBuffer).Size;
  }
  draw_list->_IdxWritePtr = local_40;
  if (uVar22 != 0) {
    if ((int)uVar22 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                    ,0x674,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar14 = (draw_list->CmdBuffer).Data;
    if (pIVar14[(ulong)uVar22 - 1].UserCallback == (ImDrawCallback)0x0) goto LAB_0018990b;
  }
  ImDrawList::AddDrawCmd(draw_list);
  pIVar14 = (draw_list->CmdBuffer).Data;
  uVar22 = (draw_list->CmdBuffer).Size;
LAB_0018990b:
  pIVar12 = pIVar14 + (long)(int)uVar22 + -1;
  pIVar1 = &draw_list->_CmdHeader;
  if (pIVar14[(long)(int)uVar22 + -1].ElemCount == 0) {
    fVar6 = (pIVar1->ClipRect).x;
    fVar7 = (pIVar1->ClipRect).y;
    fVar8 = (draw_list->_CmdHeader).ClipRect.z;
    fVar9 = (draw_list->_CmdHeader).ClipRect.w;
    uVar5 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
    *(undefined8 *)&pIVar14[(long)(int)uVar22 + -1].ClipRect.w =
         *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
    *(undefined8 *)((long)&pIVar14[(long)(int)uVar22 + -1].TextureId + 4) = uVar5;
    (pIVar12->ClipRect).x = fVar6;
    (pIVar12->ClipRect).y = fVar7;
    pIVar14[(long)(int)uVar22 + -1].ClipRect.z = fVar8;
    pIVar14[(long)(int)uVar22 + -1].ClipRect.w = fVar9;
  }
  else {
    auVar4 = vpor_avx((undefined1  [16])pIVar12->ClipRect ^ (undefined1  [16])pIVar1->ClipRect,
                      *(undefined1 (*) [16])&pIVar14[(long)(int)uVar22 + -1].ClipRect.w ^
                      *(undefined1 (*) [16])&(draw_list->_CmdHeader).ClipRect.w);
    if (auVar4 != (undefined1  [16])0x0) {
      ImDrawList::AddDrawCmd(draw_list);
    }
  }
  this->_Count = 1;
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}